

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

int bcm2835_spi_begin(void)

{
  uint32_t *paddr_00;
  bool bVar1;
  uint32_t *paddr;
  
  bVar1 = bcm2835_spi0 != (uint32_t *)0xffffffffffffffff;
  if (bVar1) {
    bcm2835_gpio_fsel('\a','\x04');
    bcm2835_gpio_fsel('\b','\x04');
    bcm2835_gpio_fsel('\t','\x04');
    bcm2835_gpio_fsel('\n','\x04');
    bcm2835_gpio_fsel('\v','\x04');
    paddr_00 = bcm2835_spi0;
    bcm2835_peri_write(bcm2835_spi0,0);
    bcm2835_peri_write_nb(paddr_00,0x30);
  }
  paddr._4_4_ = (uint)bVar1;
  return paddr._4_4_;
}

Assistant:

int bcm2835_spi_begin(void)
{
    volatile uint32_t* paddr;

    if (bcm2835_spi0 == MAP_FAILED)
      return 0; /* bcm2835_init() failed, or not root */
    
    /* Set the SPI0 pins to the Alt 0 function to enable SPI0 access on them */
    bcm2835_gpio_fsel(RPI_GPIO_P1_26, BCM2835_GPIO_FSEL_ALT0); /* CE1 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_24, BCM2835_GPIO_FSEL_ALT0); /* CE0 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_21, BCM2835_GPIO_FSEL_ALT0); /* MISO */
    bcm2835_gpio_fsel(RPI_GPIO_P1_19, BCM2835_GPIO_FSEL_ALT0); /* MOSI */
    bcm2835_gpio_fsel(RPI_GPIO_P1_23, BCM2835_GPIO_FSEL_ALT0); /* CLK */
    
    /* Set the SPI CS register to the some sensible defaults */
    paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    bcm2835_peri_write(paddr, 0); /* All 0s */
    
    /* Clear TX and RX fifos */
    bcm2835_peri_write_nb(paddr, BCM2835_SPI0_CS_CLEAR);

    return 1; // OK
}